

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

string * testing::PrintToString<bool>(string *__return_storage_ptr__,bool *value)

{
  char *pcVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  pcVar1 = "false";
  if ((ulong)*value != 0) {
    pcVar1 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_188,pcVar1,(ulong)*value ^ 5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}